

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O2

void __thiscall
Clasp::SingleOwnerPtr<Potassco::ProgramReader,_Clasp::DeleteObject>::reset
          (SingleOwnerPtr<Potassco::ProgramReader,_Clasp::DeleteObject> *this,ProgramReader *x)

{
  ProgramReader *pPVar1;
  
  pPVar1 = (ProgramReader *)(this->ptr_ & 0xfffffffffffffffe);
  if (((this->ptr_ & 1) != 0 && pPVar1 != x) &&
     (this->ptr_ = (uintp)pPVar1, pPVar1 != (ProgramReader *)0x0)) {
    (*pPVar1->_vptr_ProgramReader[1])();
  }
  this->ptr_ = (ulong)x | 1;
  return;
}

Assistant:

void reset(T* x)             {
		if (x != get() && is_owner()) { D deleter; deleter(release()); }
		ptr_ = set_bit(uintp(x),0);
	}